

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::OrphanBuilder::asCapability(OrphanBuilder *this)

{
  SegmentBuilder *segment;
  CapTableReader *capTable;
  int nestingLimit;
  WirePointer *ref;
  OrphanBuilder *in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar1;
  OrphanBuilder *this_local;
  
  segment = in_RSI->segment;
  capTable = &in_RSI->capTable->super_CapTableReader;
  ref = tagAsPtr(in_RSI);
  nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  OVar1 = WireHelpers::readCapabilityPointer
                    ((WireHelpers *)this,&segment->super_SegmentReader,capTable,ref,nestingLimit);
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> OrphanBuilder::asCapability() const {
  return WireHelpers::readCapabilityPointer(segment, capTable, tagAsPtr(), kj::maxValue);
}